

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFS.hpp
# Opt level: O2

int webfront::fs::IndexFS::open(char *__file,int __oflag,...)

{
  bool bVar1;
  string filename;
  string sStack_288;
  File local_268;
  
  std::filesystem::__cxx11::path::relative_path();
  http::std::filesystem::__cxx11::path::string(&sStack_288,(path *)&local_268);
  http::std::filesystem::__cxx11::path::~path((path *)&local_268);
  bVar1 = std::operator==(&sStack_288,"index.html");
  if (bVar1) {
    File::File<webfront::fs::IndexFS::IndexHtml>(&local_268);
    http::std::_Optional_payload_base<webfront::fs::File>::
    _Optional_payload_base<webfront::fs::File>
              ((_Optional_payload_base<webfront::fs::File> *)__file,&local_268);
  }
  else {
    bVar1 = std::operator==(&sStack_288,"favicon.ico");
    if (bVar1) {
      File::File<webfront::fs::IndexFS::WebFrontIco>(&local_268);
      http::std::_Optional_payload_base<webfront::fs::File>::
      _Optional_payload_base<webfront::fs::File>
                ((_Optional_payload_base<webfront::fs::File> *)__file,&local_268);
    }
    else {
      bVar1 = std::operator==(&sStack_288,"WebFront.js");
      if (!bVar1) {
        __file[600] = '\0';
        goto LAB_0011320b;
      }
      File::File<webfront::fs::IndexFS::WebFrontJs>(&local_268);
      http::std::_Optional_payload_base<webfront::fs::File>::
      _Optional_payload_base<webfront::fs::File>
                ((_Optional_payload_base<webfront::fs::File> *)__file,&local_268);
    }
  }
  File::~File(&local_268);
LAB_0011320b:
  std::__cxx11::string::~string((string *)&sStack_288);
  return (int)__file;
}

Assistant:

static std::optional<File> open(std::filesystem::path file) {
        auto filename = file.relative_path().string();
        if (filename == "index.html") return File(IndexHtml{});
        if (filename == "favicon.ico") return File{WebFrontIco{}};
        if (filename == "WebFront.js") return File{WebFrontJs{}};
        return {};
    }